

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

int GetExactSampleRate(snd_pcm_hw_params_t *hwParams,double *sampleRate)

{
  int iVar1;
  uint den;
  uint num;
  uint local_20;
  uint local_1c;
  
  local_20 = 1;
  if (hwParams != (snd_pcm_hw_params_t *)0x0) {
    iVar1 = snd_pcm_hw_params_get_rate_numden(hwParams,&local_1c,&local_20);
    *sampleRate = (double)local_1c / (double)local_20;
    return iVar1;
  }
  __assert_fail("hwParams",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0xc98,"int GetExactSampleRate(snd_pcm_hw_params_t *, double *)");
}

Assistant:

static int GetExactSampleRate( snd_pcm_hw_params_t *hwParams, double *sampleRate )
{
    unsigned int num, den = 1;
    int err;

    assert( hwParams );

    err = alsa_snd_pcm_hw_params_get_rate_numden( hwParams, &num, &den );
    *sampleRate = (double) num / den;

    return err;
}